

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnSetBool(XL *out,char *key,bool value)

{
  XL pvVar1;
  int iVar2;
  
  pvVar1 = *out;
  iVar2 = strcmp(key,"on_disk");
  if (iVar2 == 0) {
    *(bool *)((long)pvVar1 + 1) = value;
  }
  else {
    iVar2 = strcmp(key,"quiet");
    if (iVar2 == 0) {
      *(bool *)((long)pvVar1 + 2) = value;
    }
    else {
      iVar2 = strcmp(key,"norm");
      if (iVar2 == 0) {
        *(bool *)((long)pvVar1 + 0xb4) = value;
      }
      else {
        iVar2 = strcmp(key,"lock_free");
        if (iVar2 == 0) {
          *(bool *)((long)pvVar1 + 0xb5) = value;
        }
        else {
          iVar2 = strcmp(key,"early_stop");
          if (iVar2 == 0) {
            *(bool *)((long)pvVar1 + 500) = value;
          }
          else {
            iVar2 = strcmp(key,"sign");
            if (iVar2 == 0) {
              *(bool *)((long)pvVar1 + 0x1fc) = value;
            }
            else {
              iVar2 = strcmp(key,"sigmoid");
              if (iVar2 == 0) {
                *(bool *)((long)pvVar1 + 0x1fd) = value;
              }
              else {
                iVar2 = strcmp(key,"bin_out");
                if (iVar2 == 0) {
                  *(bool *)((long)pvVar1 + 0x1e4) = value;
                }
                else {
                  iVar2 = strcmp(key,"from_file");
                  if (iVar2 == 0) {
                    *(bool *)((long)pvVar1 + 0x1ec) = value;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetBool(XL *out, const char *key, const bool value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "on_disk") == 0) {
    xl->GetHyperParam().on_disk = value;
  } else if (strcmp(key, "quiet") == 0) {
    xl->GetHyperParam().quiet = value;
  } else if (strcmp(key, "norm") == 0) {
    xl->GetHyperParam().norm = value;
  } else if (strcmp(key, "lock_free") == 0) {
    xl->GetHyperParam().lock_free = value;
  } else if (strcmp(key, "early_stop") == 0) {
    xl->GetHyperParam().early_stop = value;
  } else if (strcmp(key, "sign") == 0) {
    xl->GetHyperParam().sign = value;
  } else if (strcmp(key, "sigmoid") == 0) {
    xl->GetHyperParam().sigmoid = value;
  } else if (strcmp(key, "bin_out") == 0) {
    xl->GetHyperParam().bin_out = value;
  } else if (strcmp(key, "from_file") == 0) {
    xl->GetHyperParam().from_file = value;
  }
  API_END();
}